

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfrule.cpp
# Opt level: O0

void icu_63::util_append64(UnicodeString *result,int64_t n)

{
  undefined1 local_260 [8];
  UnicodeString temp;
  UChar local_218 [2];
  int32_t len;
  UChar buffer [256];
  int64_t n_local;
  UnicodeString *result_local;
  
  buffer._504_8_ = n;
  temp.fUnion._52_4_ = util64_tou(n,local_218,0x200,10,'\0');
  UnicodeString::UnicodeString((UnicodeString *)local_260,local_218,temp.fUnion._52_4_);
  UnicodeString::append(result,(UnicodeString *)local_260);
  UnicodeString::~UnicodeString((UnicodeString *)local_260);
  return;
}

Assistant:

static void util_append64(UnicodeString& result, int64_t n)
{
    UChar buffer[256];
    int32_t len = util64_tou(n, buffer, sizeof(buffer));
    UnicodeString temp(buffer, len);
    result.append(temp);
}